

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

int boost::xpressive::detail::
    toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (char **begin,char *end,
              regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr,int radix,int max)

{
  int iVar1;
  char_type *pcVar2;
  int iVar3;
  
  pcVar2 = *begin;
  iVar3 = 0;
  while( true ) {
    if (pcVar2 == end) {
      return iVar3;
    }
    iVar1 = cpp_regex_traits<char>::value(&tr->super_cpp_regex_traits<char>,*pcVar2,radix);
    if (iVar1 == -1) break;
    iVar3 = iVar3 * radix + iVar1;
    if (max < iVar3) {
      return iVar3 / radix;
    }
    pcVar2 = *begin + 1;
    *begin = pcVar2;
  }
  return iVar3;
}

Assistant:

int toi(InIter &begin, InIter end, Traits const &tr, int radix = 10, int max = INT_MAX)
{
    detail::ignore_unused(tr);
    int i = 0, c = 0;
    for(; begin != end && -1 != (c = tr.value(*begin, radix)); ++begin)
    {
        if(max < ((i *= radix) += c))
            return i / radix;
    }
    return i;
}